

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Vec_Vec_t * Saig_ManDetectConstrFunc(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *psVar6;
  void **__ptr;
  Vec_Ptr_t *vInfo;
  Bar_Progress_t *p_02;
  Vec_Vec_t *p_03;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int local_60;
  int iPat;
  sat_solver *local_50;
  Cnf_Dat_t *local_48;
  int Lit;
  Aig_Man_t *local_38;
  
  iPat = 0;
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2a1,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  uVar17 = (ulong)(uint)nFrames;
  p_00 = Saig_ManUnrollCOI(p,nFrames);
  if (p_00->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pFrames) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2ab,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  if (fVerbose != 0) {
    printf("Detecting constraints with %d frames, %d conflicts, and %d propagations.\n",uVar17,
           (ulong)(uint)nConfs,(ulong)(uint)nProps);
    printf("Frames: ");
    Aig_ManPrintStats(p_00);
  }
  p_01 = Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  if (0 < p_00->vCos->nSize) {
    Lit = p_01->pVarNums[*(int *)((long)*p_00->vCos->pArray + 0x24)] * 2;
    iVar4 = sat_solver_solve(psVar6,&Lit,(lit *)&local_38,(long)nConfs,0,0,0);
    if (iVar4 == 1) {
      iVar4 = p_00->vObjs->nSize;
      lVar15 = (long)iVar4;
      __ptr = (void **)malloc(lVar15 * 0x48);
      if (0 < lVar15) {
        ppvVar7 = __ptr + lVar15;
        lVar10 = 0;
        do {
          __ptr[lVar10] = ppvVar7;
          lVar10 = lVar10 + 1;
          ppvVar7 = ppvVar7 + 8;
        } while (lVar15 != lVar10);
      }
      vInfo = (Vec_Ptr_t *)malloc(0x10);
      vInfo->nSize = iVar4;
      vInfo->nCap = iVar4;
      vInfo->pArray = __ptr;
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          pauVar1 = (undefined1 (*) [16])__ptr[lVar10];
          pauVar1[3] = (undefined1  [16])0x0;
          pauVar1[2] = (undefined1  [16])0x0;
          pauVar1[1] = (undefined1  [16])0x0;
          *pauVar1 = (undefined1  [16])0x0;
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
      }
      Saig_CollectSatValues(psVar6,p_01,vInfo,&iPat);
      pVVar8 = p_00->vObjs;
      iVar4 = pVVar8->nSize;
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          if (pVVar8->pArray[lVar10] != (void *)0x0) {
            if (lVar15 <= lVar10) goto LAB_0064bc3d;
            pbVar2 = (byte *)__ptr[lVar10];
            if ((*pbVar2 & 1) != 0) {
              pbVar2[0x30] = 0xff;
              pbVar2[0x31] = 0xff;
              pbVar2[0x32] = 0xff;
              pbVar2[0x33] = 0xff;
              pbVar2[0x34] = 0xff;
              pbVar2[0x35] = 0xff;
              pbVar2[0x36] = 0xff;
              pbVar2[0x37] = 0xff;
              pbVar2[0x38] = 0xff;
              pbVar2[0x39] = 0xff;
              pbVar2[0x3a] = 0xff;
              pbVar2[0x3b] = 0xff;
              pbVar2[0x3c] = 0xff;
              pbVar2[0x3d] = 0xff;
              pbVar2[0x3e] = 0xff;
              pbVar2[0x3f] = 0xff;
              pbVar2[0x20] = 0xff;
              pbVar2[0x21] = 0xff;
              pbVar2[0x22] = 0xff;
              pbVar2[0x23] = 0xff;
              pbVar2[0x24] = 0xff;
              pbVar2[0x25] = 0xff;
              pbVar2[0x26] = 0xff;
              pbVar2[0x27] = 0xff;
              pbVar2[0x28] = 0xff;
              pbVar2[0x29] = 0xff;
              pbVar2[0x2a] = 0xff;
              pbVar2[0x2b] = 0xff;
              pbVar2[0x2c] = 0xff;
              pbVar2[0x2d] = 0xff;
              pbVar2[0x2e] = 0xff;
              pbVar2[0x2f] = 0xff;
              pbVar2[0x10] = 0xff;
              pbVar2[0x11] = 0xff;
              pbVar2[0x12] = 0xff;
              pbVar2[0x13] = 0xff;
              pbVar2[0x14] = 0xff;
              pbVar2[0x15] = 0xff;
              pbVar2[0x16] = 0xff;
              pbVar2[0x17] = 0xff;
              pbVar2[0x18] = 0xff;
              pbVar2[0x19] = 0xff;
              pbVar2[0x1a] = 0xff;
              pbVar2[0x1b] = 0xff;
              pbVar2[0x1c] = 0xff;
              pbVar2[0x1d] = 0xff;
              pbVar2[0x1e] = 0xff;
              pbVar2[0x1f] = 0xff;
              pbVar2[0] = 0xff;
              pbVar2[1] = 0xff;
              pbVar2[2] = 0xff;
              pbVar2[3] = 0xff;
              pbVar2[4] = 0xff;
              pbVar2[5] = 0xff;
              pbVar2[6] = 0xff;
              pbVar2[7] = 0xff;
              pbVar2[8] = 0xff;
              pbVar2[9] = 0xff;
              pbVar2[10] = 0xff;
              pbVar2[0xb] = 0xff;
              pbVar2[0xc] = 0xff;
              pbVar2[0xd] = 0xff;
              pbVar2[0xe] = 0xff;
              pbVar2[0xf] = 0xff;
            }
          }
          lVar10 = lVar10 + 1;
          pVVar8 = p_00->vObjs;
          iVar4 = pVVar8->nSize;
        } while (lVar10 < iVar4);
      }
      local_50 = psVar6;
      local_48 = p_01;
      p_02 = Bar_ProgressStart(_stdout,iVar4);
      Aig_ManCleanMarkAB(p_00);
      pVVar8 = p_00->vObjs;
      if (pVVar8->nSize < 1) {
        local_60 = 0;
      }
      else {
        lVar10 = 0;
        local_60 = 0;
        do {
          pAVar3 = (Aig_Obj_t *)pVVar8->pArray[lVar10];
          if ((pAVar3 != (Aig_Obj_t *)0x0) &&
             ((uVar5 = *(uint *)&pAVar3->field_0x18 & 7, uVar5 == 2 || (uVar5 - 5 < 2)))) {
            if ((p_02 == (Bar_Progress_t *)0x0) || (p_02->nItemsNext <= lVar10)) {
              Bar_ProgressUpdate_int(p_02,(int)lVar10,(char *)0x0);
            }
            if (lVar15 <= lVar10) goto LAB_0064bc3d;
            lVar11 = 0;
            do {
              if (*(int *)((long)__ptr[lVar10] + lVar11 * 4) != -1) goto LAB_0064b7b6;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x10);
            lVar11 = 0x10;
LAB_0064b7b6:
            if ((int)lVar11 == 0x10) {
              iVar4 = Saig_DetectTryPolarity
                                (local_50,nConfs,nProps,local_48,pAVar3,0,vInfo,&iPat,fVerbose);
              uVar12 = 0x10;
            }
            else {
              lVar11 = 0;
              do {
                if (*(int *)((long)__ptr[lVar10] + lVar11 * 4) != 0) goto LAB_0064b80b;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x10);
              lVar11 = 0x10;
LAB_0064b80b:
              if ((int)lVar11 != 0x10) goto LAB_0064b85c;
              iVar4 = Saig_DetectTryPolarity
                                (local_50,nConfs,nProps,local_48,pAVar3,1,vInfo,&iPat,fVerbose);
              uVar12 = 0x20;
            }
            if (iVar4 != 0) {
              *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 | uVar12;
              local_60 = local_60 + 1;
            }
          }
LAB_0064b85c:
          lVar10 = lVar10 + 1;
          pVVar8 = p_00->vObjs;
        } while (lVar10 < pVVar8->nSize);
      }
      Bar_ProgressStop(p_02);
      if (local_60 == 0) {
        p_03 = (Vec_Vec_t *)0x0;
      }
      else {
        if (fVerbose != 0) {
          printf("Found %3d classes of candidates.\n");
        }
        p_03 = (Vec_Vec_t *)malloc(0x10);
        uVar12 = 8;
        if (6 < nFrames - 1U) {
          uVar12 = uVar17;
        }
        p_03->nSize = 0;
        iVar4 = (int)uVar12;
        p_03->nCap = iVar4;
        local_38 = p_00;
        if (iVar4 == 0) {
          ppvVar7 = (void **)0x0;
        }
        else {
          ppvVar7 = (void **)malloc((long)iVar4 << 3);
        }
        p_03->pArray = ppvVar7;
        if (0 < nFrames) {
          uVar16 = 0;
          do {
            pVVar8 = p->vObjs;
            if (0 < pVVar8->nSize) {
              lVar15 = 0;
              do {
                pvVar14 = pVVar8->pArray[lVar15];
                if ((pvVar14 != (void *)0x0) &&
                   (((uVar5 = *(uint *)((long)pvVar14 + 0x18) & 7, uVar5 == 2 || (uVar5 - 5 < 2)) &&
                    (pAVar3 = p->pObjCopies[(int)(((int)lVar15 + 1) * nFrames + ~(uint)uVar16)],
                    pAVar3 != (Aig_Obj_t *)0x0)))) {
                  uVar12 = *(ulong *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
                  if ((uVar12 & 0x10) == 0) {
                    if ((uVar12 & 0x20) == 0) goto LAB_0064ba41;
                    pvVar14 = (void *)((ulong)((uint)pAVar3 & 1) ^ (ulong)pvVar14);
                    if (uVar16 != 0) {
                      uVar5 = p_03->nSize;
                      if (p_03->nSize < 1) {
                        uVar5 = 0;
                      }
                      uVar12 = 0;
                      do {
                        if (uVar12 == uVar5) {
LAB_0064bc1e:
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                        }
                        lVar10 = (long)*(int *)((long)p_03->pArray[uVar12] + 4);
                        if (0 < lVar10) {
                          lVar11 = 0;
                          do {
                            uVar9 = uVar12;
                            if (*(void **)(*(long *)((long)p_03->pArray[uVar12] + 8) + lVar11 * 8)
                                == pvVar14) goto LAB_0064ba2b;
                            lVar11 = lVar11 + 1;
                          } while (lVar10 != lVar11);
                        }
                        uVar12 = uVar12 + 1;
                        uVar9 = uVar16;
                      } while (uVar12 != uVar16);
                      goto LAB_0064ba2b;
                    }
LAB_0064ba2f:
                    uVar9 = 0;
                  }
                  else {
                    pvVar14 = (void *)((ulong)((uint)pAVar3 & 1) ^ (ulong)pvVar14 ^ 1);
                    if (uVar16 == 0) goto LAB_0064ba2f;
                    uVar5 = p_03->nSize;
                    if (p_03->nSize < 1) {
                      uVar5 = 0;
                    }
                    uVar12 = 0;
                    do {
                      if (uVar12 == uVar5) goto LAB_0064bc1e;
                      lVar10 = (long)*(int *)((long)p_03->pArray[uVar12] + 4);
                      if (0 < lVar10) {
                        lVar11 = 0;
                        do {
                          uVar9 = uVar12;
                          if (*(void **)(*(long *)((long)p_03->pArray[uVar12] + 8) + lVar11 * 8) ==
                              pvVar14) goto LAB_0064ba2b;
                          lVar11 = lVar11 + 1;
                        } while (lVar10 != lVar11);
                      }
                      uVar12 = uVar12 + 1;
                      uVar9 = uVar16;
                    } while (uVar12 != uVar16);
LAB_0064ba2b:
                    uVar9 = uVar9 & 0xffffffff;
                  }
                  if (uVar9 == uVar16) {
                    Vec_VecPush(p_03,(uint)uVar16,pvVar14);
                  }
                }
LAB_0064ba41:
                lVar15 = lVar15 + 1;
                pVVar8 = p->vObjs;
                uVar12 = (ulong)pVVar8->nSize;
              } while (lVar15 < (long)uVar12);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar17);
        }
        iVar4 = (int)uVar12;
        if (fVerbose != 0) {
          iVar13 = p_03->nSize;
          uVar17 = (ulong)iVar13;
          if ((long)uVar17 < 1) {
            uVar16 = 0;
          }
          else {
            uVar12 = 0;
            uVar16 = 0;
            do {
              uVar16 = (ulong)(uint)((int)uVar16 + *(int *)((long)p_03->pArray[uVar12] + 4));
              uVar12 = uVar12 + 1;
            } while (uVar17 != uVar12);
          }
          printf("Found %3d candidates.\n",uVar16);
          iVar4 = (int)uVar12;
          if (0 < iVar13) {
            ppvVar7 = p_03->pArray;
            uVar16 = 0;
            do {
              printf("Level %d. Cands  =%d    ",uVar16 & 0xffffffff,
                     (ulong)*(uint *)((long)ppvVar7[uVar16] + 4));
              putchar(10);
              iVar4 = (int)uVar12;
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
        }
        if (p->pObjCopies != (Aig_Obj_t **)0x0) {
          free(p->pObjCopies);
          p->pObjCopies = (Aig_Obj_t **)0x0;
        }
        Saig_ManFilterUsingInd(p,p_03,nConfs,iVar4,fVerbose);
        p_00 = local_38;
        iVar4 = p_03->nSize;
        uVar17 = (ulong)iVar4;
        if (0 < (long)uVar17) {
          uVar12 = 0;
          iVar13 = 0;
          do {
            iVar13 = iVar13 + *(int *)((long)p_03->pArray[uVar12] + 4);
            uVar12 = uVar12 + 1;
          } while (uVar17 != uVar12);
          if (iVar13 != 0) {
            if (iVar4 < 1) {
              uVar12 = 0;
            }
            else {
              uVar16 = 0;
              uVar12 = 0;
              do {
                uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)p_03->pArray[uVar16] + 4));
                uVar16 = uVar16 + 1;
              } while (uVar17 != uVar16);
            }
            printf("Found %3d constraints after filtering.\n",uVar12);
          }
        }
        if ((fVerbose != 0) && (0 < iVar4)) {
          ppvVar7 = p_03->pArray;
          uVar12 = 0;
          do {
            printf("Level %d. Constr =%d    ",uVar12 & 0xffffffff,
                   (ulong)*(uint *)((long)ppvVar7[uVar12] + 4));
            putchar(10);
            uVar12 = uVar12 + 1;
          } while (uVar17 != uVar12);
        }
      }
      psVar6 = local_50;
      if (__ptr != (void **)0x0) {
        free(__ptr);
        vInfo->pArray = (void **)0x0;
      }
      free(vInfo);
      Cnf_DataFree(local_48);
      sat_solver_delete(psVar6);
      Aig_ManCleanMarkAB(p_00);
    }
    else if (iVar4 == 0) {
      puts("Solver could not solve the original problem.");
      Cnf_DataFree(p_01);
      sat_solver_delete(psVar6);
      p_03 = (Vec_Vec_t *)0x0;
    }
    else {
      if (iVar4 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                      ,0x2cc,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)")
        ;
      }
      p_03 = (Vec_Vec_t *)0x0;
      printf("The problem is trivially UNSAT (inductive with k=%d).\n",(ulong)(nFrames - 1));
      Cnf_DataFree(p_01);
      sat_solver_delete(psVar6);
    }
    Aig_ManStop(p_00);
    return p_03;
  }
LAB_0064bc3d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManDetectConstrFunc( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    int iPat = 0, nWordsAlloc = 16;
    Bar_Progress_t * pProgress = NULL;
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vInfo, * vNodes;
    Aig_Obj_t * pObj, * pRepr, * pObjNew;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    unsigned * pInfo;
    int i, j, k, Lit, status, nCands = 0;
    assert( Saig_ManPoNum(p) == 1 );
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The number of outputs is different from 1.\n" );
        return NULL;
    }
//printf( "Implications = %d.\n", Ssw_ManCountImplications(p, nFrames) );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    if ( fVerbose )
    {
        printf( "Detecting constraints with %d frames, %d conflicts, and %d propagations.\n", nFrames, nConfs, nProps );
        printf( "Frames: " );
        Aig_ManPrintStats( pFrames );
    }
//    Aig_ManShow( pFrames, 0, NULL );

    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//printf( "Implications = %d.\n", pSat->qhead );

    // solve the original problem
    Lit = toLitCond( pCnf->pVarNums[Aig_ObjId(Aig_ManCo(pFrames,0))], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
    {
        printf( "The problem is trivially UNSAT (inductive with k=%d).\n", nFrames-1 );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    if ( status == l_Undef )
    {
        printf( "Solver could not solve the original problem.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    assert( status == l_True );

    // create simulation info
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pFrames), nWordsAlloc );
    Vec_PtrCleanSimInfo( vInfo, 0, nWordsAlloc );
    Saig_CollectSatValues( pSat, pCnf, vInfo, &iPat );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( pInfo[0] & 1 )
            memset( (char*)pInfo, 0xff, 4*nWordsAlloc );
    }
//    Aig_ManShow( pFrames, 0, NULL );
//    Aig_ManShow( p, 0, NULL );

    // consider the nodes for ci=>!Out and label when it holds
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pFrames) );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        Bar_ProgressUpdate( pProgress, i, NULL );
        // check if the node is available in both polarities
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != ~0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 0, vInfo, &iPat, fVerbose) ) // !pObj is a constr
            {
                pObj->fMarkA = 1, nCands++;
//                printf( "!%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != 0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 1, vInfo, &iPat, fVerbose) ) //  pObj is a constr
            {
                pObj->fMarkB = 1, nCands++;
//                printf( "%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
    }
    Bar_ProgressStop( pProgress );
    if ( nCands )
    {

//        printf( "\n" );
        if ( fVerbose )
            printf( "Found %3d classes of candidates.\n", nCands );
        vCands = Vec_VecAlloc( nFrames );
        for ( k = 0; k < nFrames; k++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                    continue;
                pRepr = p->pObjCopies[nFrames*i + nFrames-1-k];
//                pRepr = p->pObjCopies[nFrames*i + k];
                if ( pRepr == NULL )
                    continue;
                if ( Aig_Regular(pRepr)->fMarkA ) // !pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj, !Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0 )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->!%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
                else if ( Aig_Regular(pRepr)->fMarkB ) //  pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj,  Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0  )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
            }
        }

//        printf( "\n" );
        if ( fVerbose )
        {
            printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }

        ABC_FREE( p->pObjCopies );
        Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
        if ( Vec_VecSizeSize(vCands) )
            printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
        if ( fVerbose )
        {
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }
    }
    Vec_PtrFree( vInfo );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManStop( pFrames );
    return vCands;
}